

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iReParser.cpp
# Opt level: O1

double __thiscall iReParser::brackets(iReParser *this)

{
  int iVar1;
  iReParser *this_00;
  double dVar2;
  
  this_00 = (iReParser *)&this->_token;
  iVar1 = std::__cxx11::string::compare((char *)this_00);
  if (iVar1 != 0) {
    dVar2 = atom(this);
    return dVar2;
  }
  nextToken(this);
  dVar2 = add_sub(this);
  iVar1 = std::__cxx11::string::compare((char *)this_00);
  if (iVar1 == 0) {
    nextToken(this);
    return dVar2;
  }
  handleErr(this_00,1);
}

Assistant:

double iReParser::brackets()
{
    double result;
    if(_token == "(") {
        nextToken();
        result = add_sub();
        if(_token != ")")
            handleErr(NOMATCH);
        nextToken();
    }
    else result = atom();
    return result;
}